

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SpecialProperties Catch::parseSpecialTag(string *tag)

{
  bool bVar1;
  SpecialProperties SVar2;
  
  bVar1 = std::operator==(tag,".");
  SVar2 = IsHidden;
  if (((!bVar1) && (bVar1 = std::operator==(tag,"hide"), !bVar1)) &&
     (bVar1 = std::operator==(tag,"!hide"), !bVar1)) {
    bVar1 = std::operator==(tag,"!throws");
    if (bVar1) {
      SVar2 = Throws;
    }
    else {
      bVar1 = std::operator==(tag,"!shouldfail");
      if (bVar1) {
        SVar2 = ShouldFail;
      }
      else {
        bVar1 = std::operator==(tag,"!mayfail");
        SVar2 = (uint)bVar1 << 3;
      }
    }
  }
  return SVar2;
}

Assistant:

inline TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
        if( tag == "." ||
            tag == "hide" ||
            tag == "!hide" )
            return TestCaseInfo::IsHidden;
        else if( tag == "!throws" )
            return TestCaseInfo::Throws;
        else if( tag == "!shouldfail" )
            return TestCaseInfo::ShouldFail;
        else if( tag == "!mayfail" )
            return TestCaseInfo::MayFail;
        else
            return TestCaseInfo::None;
    }